

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O2

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,cmake *cm,bool isNew,int labelwidth,
          int entrywidth)

{
  cmState *this_00;
  bool value;
  CacheEntryType CVar1;
  cmCursesLabelWidget *pcVar2;
  char *val;
  cmCursesWidget *this_01;
  cmCursesPathWidget *this_02;
  char *pcVar3;
  cmCursesOptionsWidget *this_03;
  cmCursesStringWidget *pcVar4;
  pointer option;
  allocator local_79;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  
  std::__cxx11::string::string((string *)&this->Key,(string *)key);
  this->LabelWidth = labelwidth;
  this->EntryWidth = entrywidth;
  pcVar2 = (cmCursesLabelWidget *)operator_new(0x40);
  cmCursesLabelWidget::cmCursesLabelWidget(pcVar2,labelwidth,1,1,1,key);
  this->Label = pcVar2;
  if (isNew) {
    pcVar2 = (cmCursesLabelWidget *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_78,"*",(allocator *)&options);
    cmCursesLabelWidget::cmCursesLabelWidget(pcVar2,1,1,1,1,&local_78);
  }
  else {
    pcVar2 = (cmCursesLabelWidget *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_78," ",(allocator *)&options);
    cmCursesLabelWidget::cmCursesLabelWidget(pcVar2,1,1,1,1,&local_78);
  }
  this->IsNewLabel = pcVar2;
  std::__cxx11::string::~string((string *)&local_78);
  this->Entry = (cmCursesWidget *)0x0;
  val = cmState::GetCacheEntryValue(cm->State,key);
  if (val == (char *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CursesDialog/cmCursesCacheEntryComposite.cxx"
                  ,0x37,
                  "cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(const std::string &, cmake *, bool, int, int)"
                 );
  }
  CVar1 = cmState::GetCacheEntryType(cm->State,key);
  switch(CVar1) {
  case BOOL:
    this_01 = (cmCursesWidget *)operator_new(0x40);
    cmCursesBoolWidget::cmCursesBoolWidget((cmCursesBoolWidget *)this_01,this->EntryWidth,1,1,1);
    this->Entry = this_01;
    value = cmSystemTools::IsOn(val);
    cmCursesBoolWidget::SetValueAsBool((cmCursesBoolWidget *)this->Entry,value);
    return;
  case PATH:
    this_02 = (cmCursesPathWidget *)operator_new(0xa0);
    cmCursesPathWidget::cmCursesPathWidget(this_02,this->EntryWidth,1,1,1);
    this->Entry = (cmCursesWidget *)this_02;
    std::__cxx11::string::string((string *)&local_78,val,(allocator *)&options);
    cmCursesStringWidget::SetString((cmCursesStringWidget *)this_02,&local_78);
    break;
  case FILEPATH:
    pcVar4 = (cmCursesStringWidget *)operator_new(0xa0);
    cmCursesFilePathWidget::cmCursesFilePathWidget
              ((cmCursesFilePathWidget *)pcVar4,this->EntryWidth,1,1,1);
    this->Entry = (cmCursesWidget *)pcVar4;
    std::__cxx11::string::string((string *)&local_78,val,(allocator *)&options);
    cmCursesStringWidget::SetString(pcVar4,&local_78);
    break;
  case STRING:
    this_00 = cm->State;
    std::__cxx11::string::string((string *)&local_78,"STRINGS",(allocator *)&options);
    pcVar3 = cmState::GetCacheEntryProperty(this_00,key,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (pcVar3 != (char *)0x0) {
      this_03 = (cmCursesOptionsWidget *)operator_new(0x60);
      cmCursesOptionsWidget::cmCursesOptionsWidget(this_03,this->EntryWidth,1,1,1);
      this->Entry = (cmCursesWidget *)this_03;
      options.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      options.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      options.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_78,pcVar3,&local_79);
      cmSystemTools::ExpandListArgument(&local_78,&options,false);
      std::__cxx11::string::~string((string *)&local_78);
      for (option = options.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          option != options.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; option = option + 1) {
        cmCursesOptionsWidget::AddOption(this_03,option);
      }
      std::__cxx11::string::string((string *)&local_78,val,&local_79);
      cmCursesOptionsWidget::SetOption(this_03,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&options);
      return;
    }
    pcVar4 = (cmCursesStringWidget *)operator_new(0x50);
    cmCursesStringWidget::cmCursesStringWidget(pcVar4,this->EntryWidth,1,1,1);
    this->Entry = (cmCursesWidget *)pcVar4;
    std::__cxx11::string::string((string *)&local_78,val,(allocator *)&options);
    cmCursesStringWidget::SetString(pcVar4,&local_78);
    break;
  default:
    goto switchD_002660ac_caseD_4;
  case UNINITIALIZED:
    cmSystemTools::Error
              ("Found an undefined variable: ",(key->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
    goto switchD_002660ac_caseD_4;
  }
  std::__cxx11::string::~string((string *)&local_78);
switchD_002660ac_caseD_4:
  return;
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
  const std::string& key, cmake *cm, bool isNew,
  int labelwidth, int entrywidth)
  : Key(key), LabelWidth(labelwidth), EntryWidth(entrywidth)
{
  this->Label = new cmCursesLabelWidget(this->LabelWidth, 1, 1, 1, key);
  if (isNew)
    {
    this->IsNewLabel = new cmCursesLabelWidget(1, 1, 1, 1, "*");
    }
  else
    {
    this->IsNewLabel = new cmCursesLabelWidget(1, 1, 1, 1, " ");
    }

  this->Entry = 0;
  const char* value = cm->GetState()->GetCacheEntryValue(key);
  assert(value);
  switch (cm->GetState()->GetCacheEntryType(key))
    {
    case cmState::BOOL:
      this->Entry = new cmCursesBoolWidget(this->EntryWidth, 1, 1, 1);
      if (cmSystemTools::IsOn(value))
        {
        static_cast<cmCursesBoolWidget*>(this->Entry)->SetValueAsBool(true);
        }
      else
        {
        static_cast<cmCursesBoolWidget*>(this->Entry)->SetValueAsBool(false);
        }
      break;
    case cmState::PATH:
      this->Entry = new cmCursesPathWidget(this->EntryWidth, 1, 1, 1);
      static_cast<cmCursesPathWidget*>(this->Entry)->SetString(value);
      break;
    case cmState::FILEPATH:
      this->Entry = new cmCursesFilePathWidget(this->EntryWidth, 1, 1, 1);
      static_cast<cmCursesFilePathWidget*>(this->Entry)->SetString(value);
      break;
    case cmState::STRING:
      {
      const char* stringsProp = cm->GetState()
                                  ->GetCacheEntryProperty(key, "STRINGS");
      if(stringsProp)
        {
        cmCursesOptionsWidget* ow =
          new cmCursesOptionsWidget(this->EntryWidth, 1, 1, 1);
        this->Entry = ow;
        std::vector<std::string> options;
        cmSystemTools::ExpandListArgument(stringsProp, options);
        for(std::vector<std::string>::iterator
              si = options.begin(); si != options.end(); ++si)
          {
          ow->AddOption(*si);
          }
        ow->SetOption(value);
        }
      else
        {
        this->Entry = new cmCursesStringWidget(this->EntryWidth, 1, 1, 1);
        static_cast<cmCursesStringWidget*>(this->Entry)->SetString(value);
        }
      break;
      }
    case cmState::UNINITIALIZED:
      cmSystemTools::Error("Found an undefined variable: ",
                           key.c_str());
      break;
    default:
      // TODO : put warning message here
      break;
    }

}